

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_inotify_poller.cc
# Opt level: O1

optional<InotifyEvent> * __thiscall
RecursiveInotifyPoller::GetNextEvent
          (optional<InotifyEvent> *__return_storage_ptr__,RecursiveInotifyPoller *this)

{
  (*this->ip_->_vptr_InotifyPoller[3])();
  if ((((__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>)._M_engaged == true) &&
      ((__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.type ==
       CREATED)) &&
     ((__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path.
      _M_dataplus._M_p
      [(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path.
       _M_string_length - 1] == '/')) {
    (*(this->super_InotifyPoller)._vptr_InotifyPoller[2])
              (this,(undefined1 *)
                    ((long)&(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).
                            field_0 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::experimental::optional<InotifyEvent>
RecursiveInotifyPoller::GetNextEvent() {
  // Add a new watch in case we've created a new directory.
  std::experimental::optional<InotifyEvent> event = ip_->GetNextEvent();
  if (event && event->type == InotifyEventType::CREATED &&
      event->path[event->path.size() - 1] == '/')
    AddWatch(event->path);
  return event;
}